

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::validForwardSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int *newSol1,int *newSol2,int *worseSol)

{
  pointer piVar1;
  pointer pMVar2;
  pointer pFVar3;
  bool bVar4;
  int iVar5;
  void *__ptr;
  undefined8 *puVar6;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *val;
  double *pdVar7;
  char *pmessage;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_R8;
  X *pXVar8;
  longdouble *in_R9;
  Scal *pSVar9;
  long lVar10;
  Index othersize;
  long lVar11;
  long lVar12;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Vec T;
  Vec sumWsq;
  undefined1 local_b1;
  double local_b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  double local_88;
  longdouble local_7c;
  int *local_70;
  int *local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  longdouble local_3c;
  
  if ((long)this->M < 1) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc((long)this->M << 3);
    if (__ptr == (void *)0x0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = operator_delete;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  lVar11 = (long)this->nSolFound;
  local_a8.m_storage.m_data = (double *)0x0;
  local_a8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a8,lVar11,1);
  if (local_a8.m_storage.m_rows != lVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a8,lVar11,1);
    lVar11 = local_a8.m_storage.m_rows;
  }
  if (0 < lVar11) {
    memset(local_a8.m_storage.m_data,0,lVar11 << 3);
  }
  lVar11 = (long)this->nSolFound;
  local_98.m_storage.m_data = (double *)0x0;
  local_98.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,lVar11,1);
  if (local_98.m_storage.m_rows != lVar11) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_98,lVar11,1);
    lVar11 = local_98.m_storage.m_rows;
  }
  if (0 < lVar11) {
    memset(local_98.m_storage.m_data,0,lVar11 << 3);
  }
  iVar5 = this->M;
  if (0 < (long)iVar5) {
    piVar1 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    pMVar2 = (this->predictions).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    pSVar9 = &(((this->experts).
                super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                .
                super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert<1,_1>).p_z_T;
    lVar10 = 0;
    do {
      lVar12 = (long)piVar1[lVar10];
      dVar14 = (double)(((X *)(pSVar9 + 6))->
                       super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage -
               (double)pMVar2[lVar12].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                       m_storage;
      dVar14 = *pdVar7 * dVar14 * dVar14;
      *(double *)((long)__ptr + lVar10 * 8) = dVar14;
      *(double *)((long)local_a8.m_storage.m_data + lVar12 * 8) =
           dVar14 + *(double *)((long)local_a8.m_storage.m_data + lVar12 * 8);
      *(double *)((long)local_98.m_storage.m_data + lVar12 * 8) =
           *pSVar9 * *pSVar9 + *(double *)((long)local_98.m_storage.m_data + lVar12 * 8);
      lVar10 = lVar10 + 1;
      pSVar9 = pSVar9 + 0x35;
      pdVar7 = pdVar7 + lVar11;
      in_R8 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
               *)local_a8.m_storage.m_data;
      in_R9 = (longdouble *)local_98.m_storage.m_data;
    } while (iVar5 != lVar10);
  }
  *worseSol = -1;
  local_70 = newSol1;
  local_68 = newSol2;
  if (this->nSolFound < 1) {
    local_b0 = -1.0;
  }
  else {
    lVar10 = 0;
    local_3c = (longdouble)1.79769313486232e+308;
    lVar11 = 0;
    local_b0 = -1.0;
    do {
      dVar14 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar11];
      dVar14 = (dVar14 * dVar14) / *(double *)((long)local_98.m_storage.m_data + lVar11 * 8) + -1.0
               + 1.0;
      lVar13 = in_ST5;
      if ((1.0 <= dVar14) && (0.0 < *(double *)((long)local_a8.m_storage.m_data + lVar11 * 8))) {
        local_88 = dVar14;
        if (0x3fe < (uint)((ulong)((long)ABS(dVar14) + -0x10000000000000) >> 0x35) ||
            (long)dVar14 < 0) {
          boost::math::policies::detail::raise_error<std::domain_error,double>
                    ("boost::math::chi_squared_distribution<%1%>::chi_squared_distribution",
                     "Degrees of freedom argument is %1%, but must be > 0 !",&local_88);
        }
        pmessage = "Degrees of freedom argument is %1%, but must be > 0 !";
        val = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
               *)&local_48;
        local_48 = local_88;
        if ((long)local_88 - 1U < 0xfffffffffffff ||
            -1 < (long)local_88 && (uint)((long)ABS(local_88) + 0xfff0000000000000U >> 0x35) < 0x3ff
           ) {
          dVar14 = *(double *)((long)local_a8.m_storage.m_data + lVar10);
          if ((uint)((ulong)((long)ABS(dVar14) + -0x10000000000000) >> 0x35) < 0x3ff &&
              -1 < (long)dVar14 || (ABS(dVar14) == 0.0 || (long)dVar14 - 1U < 0xfffffffffffff)) {
            local_50 = local_88 * 0.5;
            local_58 = dVar14 * 0.5;
            lVar13 = in_ST5;
            boost::math::detail::
            gamma_incomplete_imp<long_double,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x1,(detail *)0x0,(longdouble)local_50,(longdouble)local_58,
                       SUB81(&local_b1,0),false,in_R8,in_R9);
            local_7c = in_ST0;
            if (local_3c < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("gamma_p<%1%>(%1%, %1%)","numeric overflow");
            }
            local_60 = (double)local_7c;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            if (local_b0 <= local_60) {
              *worseSol = (int)lVar11;
              local_b0 = local_60;
            }
            goto LAB_0014c66b;
          }
          val = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                 *)((long)local_a8.m_storage.m_data + lVar10);
          pmessage = "Chi Square parameter was %1%, but must be > 0 !";
        }
        boost::math::policies::detail::raise_error<std::domain_error,double>
                  (boost::math::
                   cdf<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>(boost::math::chi_squared_distribution<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>const&,double_const&)
                   ::function,pmessage,(double *)val);
        lVar13 = in_ST5;
      }
LAB_0014c66b:
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 8;
      in_ST5 = lVar13;
    } while (lVar11 < this->nSolFound);
  }
  dVar14 = (this->param).multiValuedSignificance;
  if ((dVar14 < local_b0) && (iVar5 = this->M, 0 < iVar5)) {
    piVar1 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar15 = -1.0;
    lVar11 = 0;
    do {
      if ((piVar1[lVar11] == *worseSol) &&
         (dVar16 = *(double *)((long)__ptr + lVar11 * 8), dVar15 < dVar16)) {
        *local_70 = (int)lVar11;
        iVar5 = this->M;
        dVar15 = dVar16;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar5);
    if (0 < iVar5) {
      pFVar3 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar1 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      lVar11 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pXVar8 = &(pFVar3->super_LinearExpert<1,_1>).pred_x;
      dVar15 = -1.0;
      lVar10 = 0;
      do {
        if ((piVar1[lVar10] == *worseSol) &&
           (dVar16 = (double)(pXVar8->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).
                             m_storage -
                     (double)pFVar3[*local_70].super_LinearExpert<1,_1>.pred_x.
                             super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage,
           dVar16 = *pdVar7 * dVar16 * dVar16, dVar15 < dVar16)) {
          *local_68 = (int)lVar10;
          iVar5 = this->M;
          dVar15 = dVar16;
        }
        lVar10 = lVar10 + 1;
        pdVar7 = pdVar7 + lVar11;
        pXVar8 = pXVar8 + 0x35;
      } while (lVar10 < iVar5);
    }
  }
  bVar4 = local_b0 <= dVar14;
  free(local_98.m_storage.m_data);
  free(local_a8.m_storage.m_data);
  free(__ptr);
  return bVar4;
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::validForwardSolutions(int &newSol1, int &newSol2, int &worseSol)
{
    X diffX;
    Vec dist(M);
    Vec T = Vec::Zero(nSolFound);
    Vec sumWsq = Vec::Zero(nSolFound);
    for(int j = 0; j < M; j++)
    {
        diffX = experts[j].getPredX() - predictions[sNearest[j]];
        dist(j) = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);

        T[sNearest[j]] += dist(j);
        sumWsq(sNearest[j]) += experts[j].get_p_z()*experts[j].get_p_z();
    }

    worseSol = -1;
    Scal max_p_value = -1.0, p_value;

    for(int k = 0; k < nSolFound; k++)
    {
        Scal dof = (sum_p_z(k) * sum_p_z(k) / sumWsq(k) - 1.0) * D;

        // Small hack to prevent numerical problems
        dof += 1.0;
        if( !(dof >= 1.0) || T(k) <= 0.0)  // The negation is because of NaN problems
            continue;
//            dof = 1.0;

        if( ( p_value = cdf(boost::math::chi_squared(dof), T(k)) ) >= max_p_value )
        {
            max_p_value = p_value;
            worseSol = k;
        }
    }

    if( max_p_value <= param.multiValuedSignificance )
        return true;
    else
    {
        // Find the largest expert deviation in worse solution
        Scal dMax = -1.0;
        for(int j = 0; j < M; j++)
            if( (sNearest[j] == worseSol) && (dist(j) > dMax) )
            {
                dMax = dist(j);
                newSol1 = j;
            }

        // Find the largest expert deviation to newSol1
        dMax = -1.0;
        Scal dist2;
        for(int j = 0; j < M; j++)
            if( sNearest[j] == worseSol )
            {
                diffX = experts[j].getPredX() - experts[newSol1].getPredX();
                dist2 = diffX.dot(fInvRj.col(j).asDiagonal() * diffX);
                if( dist2 > dMax )
                {
                    dMax = dist2;
                    newSol2 = j;
                }
            }

        return false;
    }
}